

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

Array<asl::File> __thiscall asl::Directory::items(Directory *this,String *which,ItemType t)

{
  String *this_00;
  Endian *pEVar1;
  uint n;
  Array<asl::File> AVar2;
  File *pFVar3;
  bool bVar4;
  int iVar5;
  DIR *__dirp;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  size_t sVar8;
  dirent *pdVar9;
  int in_ECX;
  undefined4 in_register_00000014;
  String *this_01;
  undefined8 uVar10;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  bool bVar11;
  String dir;
  String name;
  FileInfo info;
  stat data;
  String local_180;
  int local_164;
  String local_160;
  String local_148;
  undefined1 local_130 [24];
  uint local_118;
  File *local_110;
  undefined1 local_108 [72];
  stat local_c0;
  
  this_01 = (String *)CONCAT44(in_register_00000014,t);
  this_00 = which + 1;
  local_164 = in_ECX;
  Array<asl::File>::resize((Array<asl::File> *)this_00,0);
  paVar7 = &which->field_2;
  paVar6 = paVar7;
  if (which->_size != 0) {
    paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
  }
  __name = (anon_union_16_2_78e7fdac_for_String_2 *)0x140dd2;
  if (paVar6->_space[0] != '\0') {
    __name = paVar6;
  }
  __dirp = opendir(__name->_space);
  if (__dirp == (DIR *)0x0) {
    AVar2._a = *(File **)this_00;
    *(File **)&this->_path = AVar2._a;
    LOCK();
    pEVar1 = &AVar2._a[-1]._endian;
    *pEVar1 = *pEVar1 + ENDIAN_LITTLE;
    UNLOCK();
    return (Array<asl::File>)(File *)this;
  }
  n = which->_len;
  local_110 = (File *)this;
  if (0 < (int)n) {
    paVar6 = paVar7;
    if (which->_size != 0) {
      paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
    }
    if (paVar6->_space[(ulong)n - 1] == '/') {
      String::alloc(&local_180,n);
      uVar10 = local_180.field_2._str;
      if (local_180._size == 0) {
        uVar10 = &local_180.field_2;
      }
      if (which->_size != 0) {
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
      }
      local_180._len = n;
      memcpy((void *)uVar10,paVar7,(ulong)n + 1);
      goto LAB_001352a8;
    }
  }
  local_c0.st_dev._0_1_ = 0x2f;
  String::concat(&local_180,which,(char *)&local_c0,1);
LAB_001352a8:
  local_160.field_2._space[0] = '\0';
  local_160._size = 0;
  local_160._len = 0;
  iVar5 = String::indexOf(this_01,'*',0);
  if (iVar5 < 0) {
    bVar11 = false;
  }
  else {
    if (this_01->_size == 0) {
      paVar7 = &this_01->field_2;
    }
    else {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(this_01->field_2)._str;
    }
    bVar11 = true;
    if (paVar7->_space[0] == '*') {
      bVar11 = paVar7->_space[1] != '\0';
    }
  }
LAB_001354ef:
  pdVar9 = readdir(__dirp);
  if (pdVar9 == (dirent *)0x0) {
    closedir(__dirp);
    pFVar3 = local_110;
    AVar2._a = *(File **)this_00;
    local_110->_file = (FILE *)AVar2._a;
    LOCK();
    pEVar1 = &AVar2._a[-1]._endian;
    *pEVar1 = *pEVar1 + ENDIAN_LITTLE;
    UNLOCK();
    if (local_160._size != 0) {
      free((void *)CONCAT71(local_160.field_2._1_7_,local_160.field_2._space[0]));
    }
    if (local_180._size != 0) {
      free(local_180.field_2._str);
    }
    return (Array<asl::File>)pFVar3;
  }
  if (bVar11) goto code_r0x00135303;
  goto LAB_001353ce;
code_r0x00135303:
  String::String(&local_148,pdVar9->d_name);
  iVar5 = String::indexOf(this_01,'*',0);
  if (iVar5 == -1) {
    bVar4 = String::operator==(&local_148,this_01);
  }
  else {
    String::substring((String *)local_108,this_01,0,iVar5);
    bVar4 = String::startsWith(&local_148,(String *)local_108);
    if (bVar4) {
      String::substring((String *)local_130,this_01,iVar5 + 1,this_01->_len);
      bVar4 = String::endsWith(&local_148,(String *)local_130);
      if (local_130._0_4_ != 0) {
        free((void *)local_130._8_8_);
      }
    }
    else {
      bVar4 = false;
    }
    if (local_108._0_4_ != 0) {
      free((void *)local_108._8_8_);
    }
  }
  if (local_148._size != 0) {
    free(local_148.field_2._str);
  }
  if (bVar4 != false) {
LAB_001353ce:
    if ((pdVar9->d_name[0] != '.') ||
       ((pdVar9->d_name[1] != '\0' && ((pdVar9->d_name[1] != '.' || (pdVar9->d_name[2] != '\0'))))))
    {
      uVar10 = &local_180.field_2;
      if (local_180._size != 0) {
        uVar10 = local_180.field_2._str;
      }
      String::assign(&local_160,(char *)uVar10,local_180._len);
      sVar8 = strlen(pdVar9->d_name);
      String::append(&local_160,pdVar9->d_name,(int)sVar8);
      paVar7 = &local_160.field_2;
      if (local_160._size != 0) {
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_160.field_2._1_7_,local_160.field_2._space[0]);
      }
      iVar5 = stat(paVar7->_space,&local_c0);
      if (iVar5 == 0) {
        if (local_164 == 0) {
          if ((local_c0.st_mode & 0xf000) == 0x4000) goto LAB_001354ef;
        }
        else if ((local_164 == 1) && ((local_c0.st_mode & 0xf000) != 0x4000)) goto LAB_001354ef;
        local_130._8_8_ = (undefined8)local_c0.st_mtim.tv_sec;
        local_130._16_8_ = (undefined8)local_c0.st_ctim.tv_sec;
        local_130._0_8_ = local_c0.st_size;
        local_118 = local_c0.st_mode;
        File::File((File *)local_108,&local_160,(FileInfo *)local_130);
        Array<asl::File>::insert((Array<asl::File> *)this_00,-1,(File *)local_108);
        File::~File((File *)local_108);
      }
    }
  }
  goto LAB_001354ef;
}

Assistant:

Array<File> Directory::items(const String& which, Directory::ItemType t)
{
	_files.clear();
	DIR* d = opendir(_path != ""? *_path : "/");
	if(!d)
		return _files;
	String dir = _path.endsWith('/')? _path : (_path+'/');
	String name;
	bool wildcard = which.contains('*') && which != "*";
	
	while(dirent* entry=readdir(d))
	{
		struct stat data;
		if(wildcard && !match(entry->d_name, which))
			continue;
		if(!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
			continue;
		name = dir;
		name += (const char*)entry->d_name;
		if(!stat(name, &data)) {
			if( (t==DIRE && !S_ISDIR(data.st_mode)) ||
				(t==FILE && S_ISDIR(data.st_mode)) )
				continue;
			_files << File(name, infoFor(data));
		}
	}
	closedir(d);
	return _files;
}